

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.cpp
# Opt level: O0

rotation_t *
opengv::relative_pose::ge
          (RelativeAdapterBase *adapter,Indices *indices,geOutput_t *output,bool useWeights)

{
  Scalar SVar1;
  Scalar SVar2;
  rotation_t *prVar3;
  long *plVar4;
  int iVar5;
  Scalar *pSVar6;
  Scalar *pSVar7;
  cayley_t *in_RCX;
  Indices *in_RDX;
  long *in_RSI;
  rotation_t *in_RDI;
  byte in_R8B;
  __type _Var8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> PVar29;
  Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>
  PVar30;
  rotation_t startingRotation;
  Vector3d fprime;
  Vector3d f;
  size_t i_3;
  MatrixXd Hcross;
  size_t i_2;
  Vector3d pointsCenter2;
  Vector3d pointsCenter1;
  Matrix<double,_1,_9,_1,_1,_9> f1_19;
  double temp;
  Matrix<double,_1,_9,_1,_1,_9> f2_19;
  Vector3d t2;
  Vector3d t1;
  Matrix3d F;
  bearingVector_t f2;
  bearingVector_t f1;
  double weight;
  size_t i_1;
  size_t i;
  double norm;
  Matrix<double,_9,_9,_0,_9,_9> m22P;
  Matrix<double,_9,_9,_0,_9,_9> m12P;
  Matrix<double,_9,_9,_0,_9,_9> m11P;
  Matrix<double,_3,_9,_0,_3,_9> z2P;
  Matrix<double,_3,_9,_0,_3,_9> y2P;
  Matrix<double,_3,_9,_0,_3,_9> x2P;
  Matrix<double,_3,_9,_0,_3,_9> z1P;
  Matrix<double,_3,_9,_0,_3,_9> y1P;
  Matrix<double,_3,_9,_0,_3,_9> x1P;
  Matrix3d zxF;
  Matrix3d yzF;
  Matrix3d xyF;
  Matrix3d zzF;
  Matrix3d yyF;
  Matrix3d xxF;
  size_t numberCorrespondences;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  *in_stack_ffffffffffffdb38;
  Matrix<double,_3,_3,_0,_3,_3> *other;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_stack_ffffffffffffdb40;
  Matrix<double,_3,_9,_0,_3,_9> *x1P_00;
  Indices *in_stack_ffffffffffffdb48;
  MatrixBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *in_stack_ffffffffffffdb50;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_stack_ffffffffffffdb58;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  *in_stack_ffffffffffffdb60;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *in_stack_ffffffffffffdb68;
  StorageBaseType *in_stack_ffffffffffffdb80;
  double *in_stack_ffffffffffffdb88;
  geOutput_t *in_stack_ffffffffffffdb90;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_ffffffffffffdb98;
  rotation_t *in_stack_ffffffffffffdc88;
  non_const_type local_2140;
  Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>
  local_2138;
  undefined1 local_2128 [24];
  undefined1 local_2110 [72];
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_20c8;
  undefined1 local_2080 [24];
  undefined1 local_2068 [72];
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_2020;
  MatrixXd *Hcross_00;
  undefined1 local_1f50 [24];
  undefined1 local_1f38 [72];
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_1ef0;
  undefined1 local_1ee0 [24];
  undefined1 local_1ec8 [72];
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_1e80;
  MatrixXd *local_1e70;
  non_const_type local_1e18;
  Product<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>
  local_1e10;
  non_const_type local_1de0;
  Product<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>
  local_1dd8;
  non_const_type local_1da8;
  Product<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>
  local_1da0;
  non_const_type local_19e0;
  non_const_type local_1940;
  Matrix3d *in_stack_ffffffffffffe6c8;
  Matrix3d *in_stack_ffffffffffffe6d0;
  Matrix3d *in_stack_ffffffffffffe6d8;
  Matrix3d *in_stack_ffffffffffffe6e0;
  Matrix3d *in_stack_ffffffffffffe6e8;
  Matrix3d *in_stack_ffffffffffffe6f0;
  undefined1 local_13a8 [24];
  undefined1 local_1390 [24];
  double local_1378;
  double local_1310;
  double local_12a8;
  double local_1240;
  double local_11d8;
  double local_1170;
  non_const_type local_1108;
  Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>
  local_1100;
  undefined1 local_10a8 [24];
  undefined1 local_1090 [72];
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_1048;
  undefined1 local_1020 [24];
  undefined1 local_1008 [72];
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_fc0;
  rotation_t *local_f98;
  MatrixXd *local_f90;
  MatrixXd *local_f88;
  double local_f80;
  Matrix<double,_9,_9,_0,_9,_9> local_f68;
  Matrix<double,_9,_9,_0,_9,_9> local_cd0;
  Matrix<double,_3,_9,_0,_3,_9> local_a38 [3];
  Matrix<double,_3,_9,_0,_3,_9> local_7a0;
  Matrix<double,_3,_9,_0,_3,_9> local_6b8;
  Matrix<double,_3,_9,_0,_3,_9> local_5d0;
  Matrix<double,_3,_9,_0,_3,_9> local_4e8;
  Matrix<double,_3,_9,_0,_3,_9> local_400;
  Matrix<double,_3,_3,_0,_3,_3> local_318 [10];
  MatrixXd *local_30;
  byte local_21;
  cayley_t *local_20;
  long *local_10;
  
  local_21 = in_R8B & 1;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_30 = (MatrixXd *)Indices::size(in_RDX);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Zero();
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_ffffffffffffdb40,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)in_stack_ffffffffffffdb38);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Zero();
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_ffffffffffffdb40,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)in_stack_ffffffffffffdb38);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Zero();
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_ffffffffffffdb40,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)in_stack_ffffffffffffdb38);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Zero();
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_ffffffffffffdb40,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)in_stack_ffffffffffffdb38);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Zero();
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_ffffffffffffdb40,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)in_stack_ffffffffffffdb38);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Zero();
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_ffffffffffffdb40,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
              *)in_stack_ffffffffffffdb38);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>::Zero();
  Eigen::Matrix<double,3,9,0,3,9>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,9,0,3,9>>>
            ((Matrix<double,_3,_9,_0,_3,_9> *)in_stack_ffffffffffffdb40,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>_>_>
              *)in_stack_ffffffffffffdb38);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>::Zero();
  Eigen::Matrix<double,3,9,0,3,9>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,9,0,3,9>>>
            ((Matrix<double,_3,_9,_0,_3,_9> *)in_stack_ffffffffffffdb40,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>_>_>
              *)in_stack_ffffffffffffdb38);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>::Zero();
  Eigen::Matrix<double,3,9,0,3,9>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,9,0,3,9>>>
            ((Matrix<double,_3,_9,_0,_3,_9> *)in_stack_ffffffffffffdb40,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>_>_>
              *)in_stack_ffffffffffffdb38);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>::Zero();
  Eigen::Matrix<double,3,9,0,3,9>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,9,0,3,9>>>
            ((Matrix<double,_3,_9,_0,_3,_9> *)in_stack_ffffffffffffdb40,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>_>_>
              *)in_stack_ffffffffffffdb38);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>::Zero();
  Eigen::Matrix<double,3,9,0,3,9>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,9,0,3,9>>>
            ((Matrix<double,_3,_9,_0,_3,_9> *)in_stack_ffffffffffffdb40,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>_>_>
              *)in_stack_ffffffffffffdb38);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_>::Zero();
  Eigen::Matrix<double,3,9,0,3,9>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,9,0,3,9>>>
            ((Matrix<double,_3,_9,_0,_3,_9> *)in_stack_ffffffffffffdb40,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_9,_0,_3,_9>_>_>
              *)in_stack_ffffffffffffdb38);
  Eigen::DenseBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>::Zero();
  Eigen::Matrix<double,9,9,0,9,9>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,9,9,0,9,9>>>
            ((Matrix<double,_9,_9,_0,_9,_9> *)in_stack_ffffffffffffdb40,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_9,_9,_0,_9,_9>_>_>
              *)in_stack_ffffffffffffdb38);
  Eigen::DenseBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>::Zero();
  Eigen::Matrix<double,9,9,0,9,9>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,9,9,0,9,9>>>
            ((Matrix<double,_9,_9,_0,_9,_9> *)in_stack_ffffffffffffdb40,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_9,_9,_0,_9,_9>_>_>
              *)in_stack_ffffffffffffdb38);
  Eigen::DenseBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>::Zero();
  Eigen::Matrix<double,9,9,0,9,9>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,9,9,0,9,9>>>
            ((Matrix<double,_9,_9,_0,_9,_9> *)in_stack_ffffffffffffdb40,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_9,_9,_0,_9,_9>_>_>
              *)in_stack_ffffffffffffdb38);
  local_f80 = 0.0;
  for (local_f88 = (MatrixXd *)0x0; plVar4 = local_10, local_f88 < local_30;
      local_f88 = (MatrixXd *)
                  ((long)&(local_f88->
                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                          m_storage.m_data + 1)) {
    iVar5 = Indices::operator[](in_stack_ffffffffffffdb48,
                                (int)((ulong)in_stack_ffffffffffffdb40 >> 0x20));
    (**(code **)(*plVar4 + 0x20))(plVar4,(long)iVar5);
    _Var8 = std::pow<double,int>
                      ((double)in_stack_ffffffffffffdb40,
                       (int)((ulong)in_stack_ffffffffffffdb38 >> 0x20));
    local_f80 = _Var8 + local_f80;
  }
  local_f80 = sqrt(local_f80);
  for (local_f90 = (MatrixXd *)0x0; plVar4 = local_10, local_f90 < local_30;
      local_f90 = (MatrixXd *)
                  ((long)&(local_f90->
                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                          m_storage.m_data + 1)) {
    local_f98 = (rotation_t *)0x3ff0000000000000;
    if ((local_21 & 1) != 0) {
      iVar5 = Indices::operator[](in_stack_ffffffffffffdb48,
                                  (int)((ulong)in_stack_ffffffffffffdb40 >> 0x20));
      dVar9 = (double)(**(code **)(*plVar4 + 0x20))(plVar4,(long)iVar5);
      local_f98 = (rotation_t *)(dVar9 / local_f80);
    }
    plVar4 = local_10;
    iVar5 = Indices::operator[](in_stack_ffffffffffffdb48,
                                (int)((ulong)in_stack_ffffffffffffdb40 >> 0x20));
    (**(code **)(*plVar4 + 0x30))(local_1008,plVar4,(long)iVar5);
    plVar4 = local_10;
    iVar5 = Indices::operator[](in_stack_ffffffffffffdb48,
                                (int)((ulong)in_stack_ffffffffffffdb40 >> 0x20));
    (**(code **)(*plVar4 + 0x10))(local_1020,plVar4,(long)iVar5);
    local_fc0 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                          (in_stack_ffffffffffffdb40,
                           (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                           in_stack_ffffffffffffdb38);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_ffffffffffffdb40,
               (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)in_stack_ffffffffffffdb38);
    plVar4 = local_10;
    iVar5 = Indices::operator[](in_stack_ffffffffffffdb48,
                                (int)((ulong)in_stack_ffffffffffffdb40 >> 0x20));
    (**(code **)(*plVar4 + 0x40))(local_1090,plVar4,(long)iVar5);
    plVar4 = local_10;
    iVar5 = Indices::operator[](in_stack_ffffffffffffdb48,
                                (int)((ulong)in_stack_ffffffffffffdb40 >> 0x20));
    (**(code **)(*plVar4 + 0x18))(local_10a8,plVar4,(long)iVar5);
    local_1048 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                           (in_stack_ffffffffffffdb40,
                            (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                            in_stack_ffffffffffffdb38);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_ffffffffffffdb40,
               (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)in_stack_ffffffffffffdb38);
    local_1108 = (non_const_type)
                 Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                           ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                            in_stack_ffffffffffffdb38);
    local_1100 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator*
                           ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                            in_stack_ffffffffffffdb40,
                            (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)
                            in_stack_ffffffffffffdb38);
    Eigen::Matrix<double,3,3,0,3,3>::
    Matrix<Eigen::Product<Eigen::Matrix<double,3,1,0,3,1>,Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>,0>>
              ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_ffffffffffffdb40,
               (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
                *)in_stack_ffffffffffffdb38);
    prVar3 = local_f98;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
    dVar9 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
    local_1170 = (double)prVar3 * dVar9 * *pSVar6;
    Eigen::operator*(in_stack_ffffffffffffdb88,in_stack_ffffffffffffdb80);
    Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator+
              (in_stack_ffffffffffffdb68,in_stack_ffffffffffffdb60);
    Eigen::Matrix<double,3,3,0,3,3>::operator=
              ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_ffffffffffffdb40,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                *)in_stack_ffffffffffffdb38);
    prVar3 = local_f98;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
    dVar9 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
    local_11d8 = (double)prVar3 * dVar9 * *pSVar6;
    Eigen::operator*(in_stack_ffffffffffffdb88,in_stack_ffffffffffffdb80);
    Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator+
              (in_stack_ffffffffffffdb68,in_stack_ffffffffffffdb60);
    Eigen::Matrix<double,3,3,0,3,3>::operator=
              ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_ffffffffffffdb40,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                *)in_stack_ffffffffffffdb38);
    prVar3 = local_f98;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
    dVar9 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
    local_1240 = (double)prVar3 * dVar9 * *pSVar6;
    Eigen::operator*(in_stack_ffffffffffffdb88,in_stack_ffffffffffffdb80);
    Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator+
              (in_stack_ffffffffffffdb68,in_stack_ffffffffffffdb60);
    Eigen::Matrix<double,3,3,0,3,3>::operator=
              ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_ffffffffffffdb40,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                *)in_stack_ffffffffffffdb38);
    prVar3 = local_f98;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
    dVar9 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
    local_12a8 = (double)prVar3 * dVar9 * *pSVar6;
    Eigen::operator*(in_stack_ffffffffffffdb88,in_stack_ffffffffffffdb80);
    Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator+
              (in_stack_ffffffffffffdb68,in_stack_ffffffffffffdb60);
    Eigen::Matrix<double,3,3,0,3,3>::operator=
              ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_ffffffffffffdb40,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                *)in_stack_ffffffffffffdb38);
    prVar3 = local_f98;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
    dVar9 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
    local_1310 = (double)prVar3 * dVar9 * *pSVar6;
    Eigen::operator*(in_stack_ffffffffffffdb88,in_stack_ffffffffffffdb80);
    Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator+
              (in_stack_ffffffffffffdb68,in_stack_ffffffffffffdb60);
    Eigen::Matrix<double,3,3,0,3,3>::operator=
              ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_ffffffffffffdb40,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                *)in_stack_ffffffffffffdb38);
    prVar3 = local_f98;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
    dVar9 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
    local_1378 = (double)prVar3 * dVar9 * *pSVar6;
    Eigen::operator*(in_stack_ffffffffffffdb88,in_stack_ffffffffffffdb80);
    Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator+
              (in_stack_ffffffffffffdb68,in_stack_ffffffffffffdb60);
    Eigen::Matrix<double,3,3,0,3,3>::operator=
              ((Matrix<double,_3,_3,_0,_3,_3> *)in_stack_ffffffffffffdb40,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                *)in_stack_ffffffffffffdb38);
    plVar4 = local_10;
    iVar5 = Indices::operator[](in_stack_ffffffffffffdb48,
                                (int)((ulong)in_stack_ffffffffffffdb40 >> 0x20));
    (**(code **)(*plVar4 + 0x28))(local_1390,plVar4,(long)iVar5);
    plVar4 = local_10;
    iVar5 = Indices::operator[](in_stack_ffffffffffffdb48,
                                (int)((ulong)in_stack_ffffffffffffdb40 >> 0x20));
    (**(code **)(*plVar4 + 0x38))(local_13a8,plVar4,(long)iVar5);
    Eigen::Matrix<double,_1,_9,_1,_1,_9>::Matrix((Matrix<double,_1,_9,_1,_1,_9> *)0xc481de);
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
    SVar1 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
    SVar2 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
    dVar9 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = SVar2;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = SVar1;
    auVar23._8_8_ = 0;
    auVar23._0_8_ = -(dVar9 * *pSVar6);
    auVar11 = vfmadd213sd_fma(auVar11,auVar17,auVar23);
    dVar10 = auVar11._0_8_;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
    dVar9 = *pSVar6;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38,0xc482cc);
    *pSVar7 = dVar9 * dVar10;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
    dVar9 = *pSVar6;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38,0xc48317);
    *pSVar7 = dVar9 * dVar10;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
    dVar9 = *pSVar6;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38,0xc48362);
    *pSVar7 = dVar9 * dVar10;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
    SVar1 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
    SVar2 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
    dVar9 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = SVar2;
    auVar18._8_8_ = 0;
    auVar18._0_8_ = SVar1;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = -(dVar9 * *pSVar6);
    auVar11 = vfmadd213sd_fma(auVar12,auVar18,auVar24);
    dVar10 = auVar11._0_8_;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
    dVar9 = *pSVar6;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38,0xc4845d);
    *pSVar7 = dVar9 * dVar10;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
    dVar9 = *pSVar6;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38,0xc484a8);
    *pSVar7 = dVar9 * dVar10;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
    dVar9 = *pSVar6;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38,0xc484f3);
    *pSVar7 = dVar9 * dVar10;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
    SVar1 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
    SVar2 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
    dVar9 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
    auVar13._8_8_ = 0;
    auVar13._0_8_ = SVar2;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = SVar1;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = -(dVar9 * *pSVar6);
    auVar11 = vfmadd213sd_fma(auVar13,auVar19,auVar25);
    dVar10 = auVar11._0_8_;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
    dVar9 = *pSVar6;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38,0xc485ee);
    *pSVar7 = dVar9 * dVar10;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
    dVar9 = *pSVar6;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38,0xc48639);
    *pSVar7 = dVar9 * dVar10;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
    dVar9 = *pSVar6;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38,0xc48684);
    *pSVar7 = dVar9 * dVar10;
    Eigen::Matrix<double,_1,_9,_1,_1,_9>::Matrix((Matrix<double,_1,_9,_1,_1,_9> *)0xc4869e);
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
    SVar1 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
    SVar2 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
    dVar9 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
    auVar14._8_8_ = 0;
    auVar14._0_8_ = SVar2;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = SVar1;
    auVar26._8_8_ = 0;
    auVar26._0_8_ = -(dVar9 * *pSVar6);
    auVar11 = vfmadd213sd_fma(auVar14,auVar20,auVar26);
    dVar10 = auVar11._0_8_;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
    dVar9 = *pSVar6;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38,0xc4878c);
    *pSVar7 = dVar9 * dVar10;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
    dVar9 = *pSVar6;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38,0xc487d7);
    *pSVar7 = dVar9 * dVar10;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
    dVar9 = *pSVar6;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38,0xc48822);
    *pSVar7 = dVar9 * dVar10;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
    SVar1 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
    SVar2 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
    dVar9 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
    auVar15._8_8_ = 0;
    auVar15._0_8_ = SVar2;
    auVar21._8_8_ = 0;
    auVar21._0_8_ = SVar1;
    auVar27._8_8_ = 0;
    auVar27._0_8_ = -(dVar9 * *pSVar6);
    auVar11 = vfmadd213sd_fma(auVar15,auVar21,auVar27);
    dVar10 = auVar11._0_8_;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
    dVar9 = *pSVar6;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38,0xc4891d);
    *pSVar7 = dVar9 * dVar10;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
    dVar9 = *pSVar6;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38,0xc48968);
    *pSVar7 = dVar9 * dVar10;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
    dVar9 = *pSVar6;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38,0xc489b3);
    *pSVar7 = dVar9 * dVar10;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
    SVar1 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
    SVar2 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
    dVar9 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
    auVar16._8_8_ = 0;
    auVar16._0_8_ = SVar2;
    auVar22._8_8_ = 0;
    auVar22._0_8_ = SVar1;
    auVar28._8_8_ = 0;
    auVar28._0_8_ = -(dVar9 * *pSVar6);
    auVar11 = vfmadd213sd_fma(auVar16,auVar22,auVar28);
    dVar10 = auVar11._0_8_;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
    dVar9 = *pSVar6;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38,0xc48aae);
    *pSVar7 = dVar9 * dVar10;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
    dVar9 = *pSVar6;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38,0xc48af9);
    *pSVar7 = dVar9 * dVar10;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
    dVar9 = *pSVar6;
    pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>,_1> *)
                        in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38,0xc48b44);
    *pSVar7 = dVar9 * dVar10;
    if ((local_21 & 1) == 0) {
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                 in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
      Eigen::operator*(in_stack_ffffffffffffdb88,(StorageBaseType *)in_stack_ffffffffffffdb80);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
      ::operator*(in_stack_ffffffffffffdb58,in_stack_ffffffffffffdb50);
      Eigen::MatrixBase<Eigen::Matrix<double,3,9,0,3,9>>::operator+
                ((MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)in_stack_ffffffffffffdb68,
                 (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>_>
                  *)in_stack_ffffffffffffdb60);
      Eigen::Matrix<double,3,9,0,3,9>::operator=
                ((Matrix<double,_3,_9,_0,_3,_9> *)in_stack_ffffffffffffdb40,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>_>_>
                  *)in_stack_ffffffffffffdb38);
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                 in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
      Eigen::operator*(in_stack_ffffffffffffdb88,(StorageBaseType *)in_stack_ffffffffffffdb80);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
      ::operator*(in_stack_ffffffffffffdb58,in_stack_ffffffffffffdb50);
      Eigen::MatrixBase<Eigen::Matrix<double,3,9,0,3,9>>::operator+
                ((MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)in_stack_ffffffffffffdb68,
                 (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>_>
                  *)in_stack_ffffffffffffdb60);
      Eigen::Matrix<double,3,9,0,3,9>::operator=
                ((Matrix<double,_3,_9,_0,_3,_9> *)in_stack_ffffffffffffdb40,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>_>_>
                  *)in_stack_ffffffffffffdb38);
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                 in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
      Eigen::operator*(in_stack_ffffffffffffdb88,(StorageBaseType *)in_stack_ffffffffffffdb80);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
      ::operator*(in_stack_ffffffffffffdb58,in_stack_ffffffffffffdb50);
      Eigen::MatrixBase<Eigen::Matrix<double,3,9,0,3,9>>::operator+
                ((MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)in_stack_ffffffffffffdb68,
                 (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>_>
                  *)in_stack_ffffffffffffdb60);
      Eigen::Matrix<double,3,9,0,3,9>::operator=
                ((Matrix<double,_3,_9,_0,_3,_9> *)in_stack_ffffffffffffdb40,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>_>_>
                  *)in_stack_ffffffffffffdb38);
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                 in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
      Eigen::operator*(in_stack_ffffffffffffdb88,(StorageBaseType *)in_stack_ffffffffffffdb80);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
      ::operator*(in_stack_ffffffffffffdb58,in_stack_ffffffffffffdb50);
      Eigen::MatrixBase<Eigen::Matrix<double,3,9,0,3,9>>::operator+
                ((MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)in_stack_ffffffffffffdb68,
                 (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>_>
                  *)in_stack_ffffffffffffdb60);
      Eigen::Matrix<double,3,9,0,3,9>::operator=
                ((Matrix<double,_3,_9,_0,_3,_9> *)in_stack_ffffffffffffdb40,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>_>_>
                  *)in_stack_ffffffffffffdb38);
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                 in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
      Eigen::operator*(in_stack_ffffffffffffdb88,(StorageBaseType *)in_stack_ffffffffffffdb80);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
      ::operator*(in_stack_ffffffffffffdb58,in_stack_ffffffffffffdb50);
      Eigen::MatrixBase<Eigen::Matrix<double,3,9,0,3,9>>::operator+
                ((MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)in_stack_ffffffffffffdb68,
                 (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>_>
                  *)in_stack_ffffffffffffdb60);
      Eigen::Matrix<double,3,9,0,3,9>::operator=
                ((Matrix<double,_3,_9,_0,_3,_9> *)in_stack_ffffffffffffdb40,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>_>_>
                  *)in_stack_ffffffffffffdb38);
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                 in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
      Eigen::operator*(in_stack_ffffffffffffdb88,(StorageBaseType *)in_stack_ffffffffffffdb80);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
      ::operator*(in_stack_ffffffffffffdb58,in_stack_ffffffffffffdb50);
      Eigen::MatrixBase<Eigen::Matrix<double,3,9,0,3,9>>::operator+
                ((MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)in_stack_ffffffffffffdb68,
                 (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>_>
                  *)in_stack_ffffffffffffdb60);
      Eigen::Matrix<double,3,9,0,3,9>::operator=
                ((Matrix<double,_3,_9,_0,_3,_9> *)in_stack_ffffffffffffdb40,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>_>_>
                  *)in_stack_ffffffffffffdb38);
      local_1da8 = (non_const_type)
                   Eigen::DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::transpose
                             ((DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)
                              in_stack_ffffffffffffdb38);
      local_1da0 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>>::operator*
                             ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
                               *)in_stack_ffffffffffffdb40,
                              (MatrixBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)
                              in_stack_ffffffffffffdb38);
      Eigen::MatrixBase<Eigen::Matrix<double,9,9,0,9,9>>::operator-
                ((MatrixBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_> *)in_stack_ffffffffffffdb68,
                 (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>_>
                  *)in_stack_ffffffffffffdb60);
      Eigen::Matrix<double,9,9,0,9,9>::operator=
                ((Matrix<double,_9,_9,_0,_9,_9> *)in_stack_ffffffffffffdb40,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_9,_9,_0,_9,_9>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>_>_>
                  *)in_stack_ffffffffffffdb38);
      local_1de0 = (non_const_type)
                   Eigen::DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::transpose
                             ((DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)
                              in_stack_ffffffffffffdb38);
      local_1dd8 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>>::operator*
                             ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
                               *)in_stack_ffffffffffffdb40,
                              (MatrixBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)
                              in_stack_ffffffffffffdb38);
      Eigen::MatrixBase<Eigen::Matrix<double,9,9,0,9,9>>::operator-
                ((MatrixBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_> *)in_stack_ffffffffffffdb68,
                 (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>_>
                  *)in_stack_ffffffffffffdb60);
      Eigen::Matrix<double,9,9,0,9,9>::operator=
                ((Matrix<double,_9,_9,_0,_9,_9> *)in_stack_ffffffffffffdb40,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_9,_9,_0,_9,_9>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>_>_>
                  *)in_stack_ffffffffffffdb38);
      local_1e18 = (non_const_type)
                   Eigen::DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::transpose
                             ((DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)
                              in_stack_ffffffffffffdb38);
      local_1e10 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>>::operator*
                             ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>
                               *)in_stack_ffffffffffffdb40,
                              (MatrixBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)
                              in_stack_ffffffffffffdb38);
      Eigen::MatrixBase<Eigen::Matrix<double,9,9,0,9,9>>::operator-
                ((MatrixBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_> *)in_stack_ffffffffffffdb68,
                 (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>_>
                  *)in_stack_ffffffffffffdb60);
      Eigen::Matrix<double,9,9,0,9,9>::operator=
                ((Matrix<double,_9,_9,_0,_9,_9> *)in_stack_ffffffffffffdb40,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_9,_9,_0,_9,_9>,_const_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>_>_>
                  *)in_stack_ffffffffffffdb38);
    }
    else {
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                 in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
      Eigen::operator*(in_stack_ffffffffffffdb88,(StorageBaseType *)in_stack_ffffffffffffdb80);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
      ::operator*(in_stack_ffffffffffffdb58,in_stack_ffffffffffffdb50);
      Eigen::MatrixBase<Eigen::Matrix<double,3,9,0,3,9>>::operator+
                ((MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)in_stack_ffffffffffffdb68,
                 (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>_>
                  *)in_stack_ffffffffffffdb60);
      Eigen::Matrix<double,3,9,0,3,9>::operator=
                ((Matrix<double,_3,_9,_0,_3,_9> *)in_stack_ffffffffffffdb40,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>_>_>
                  *)in_stack_ffffffffffffdb38);
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                 in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
      Eigen::operator*(in_stack_ffffffffffffdb88,(StorageBaseType *)in_stack_ffffffffffffdb80);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
      ::operator*(in_stack_ffffffffffffdb58,in_stack_ffffffffffffdb50);
      Eigen::MatrixBase<Eigen::Matrix<double,3,9,0,3,9>>::operator+
                ((MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)in_stack_ffffffffffffdb68,
                 (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>_>
                  *)in_stack_ffffffffffffdb60);
      Eigen::Matrix<double,3,9,0,3,9>::operator=
                ((Matrix<double,_3,_9,_0,_3,_9> *)in_stack_ffffffffffffdb40,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>_>_>
                  *)in_stack_ffffffffffffdb38);
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                 in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
      Eigen::operator*(in_stack_ffffffffffffdb88,(StorageBaseType *)in_stack_ffffffffffffdb80);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
      ::operator*(in_stack_ffffffffffffdb58,in_stack_ffffffffffffdb50);
      Eigen::MatrixBase<Eigen::Matrix<double,3,9,0,3,9>>::operator+
                ((MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)in_stack_ffffffffffffdb68,
                 (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>_>
                  *)in_stack_ffffffffffffdb60);
      Eigen::Matrix<double,3,9,0,3,9>::operator=
                ((Matrix<double,_3,_9,_0,_3,_9> *)in_stack_ffffffffffffdb40,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>_>_>
                  *)in_stack_ffffffffffffdb38);
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                 in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
      Eigen::operator*(in_stack_ffffffffffffdb88,(StorageBaseType *)in_stack_ffffffffffffdb80);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
      ::operator*(in_stack_ffffffffffffdb58,in_stack_ffffffffffffdb50);
      Eigen::MatrixBase<Eigen::Matrix<double,3,9,0,3,9>>::operator+
                ((MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)in_stack_ffffffffffffdb68,
                 (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>_>
                  *)in_stack_ffffffffffffdb60);
      Eigen::Matrix<double,3,9,0,3,9>::operator=
                ((Matrix<double,_3,_9,_0,_3,_9> *)in_stack_ffffffffffffdb40,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>_>_>
                  *)in_stack_ffffffffffffdb38);
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                 in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
      Eigen::operator*(in_stack_ffffffffffffdb88,(StorageBaseType *)in_stack_ffffffffffffdb80);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
      ::operator*(in_stack_ffffffffffffdb58,in_stack_ffffffffffffdb50);
      Eigen::MatrixBase<Eigen::Matrix<double,3,9,0,3,9>>::operator+
                ((MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)in_stack_ffffffffffffdb68,
                 (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>_>
                  *)in_stack_ffffffffffffdb60);
      Eigen::Matrix<double,3,9,0,3,9>::operator=
                ((Matrix<double,_3,_9,_0,_3,_9> *)in_stack_ffffffffffffdb40,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>_>_>
                  *)in_stack_ffffffffffffdb38);
      in_stack_ffffffffffffdc88 = local_f98;
      Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                 in_stack_ffffffffffffdb40,(Index)in_stack_ffffffffffffdb38);
      Eigen::operator*(in_stack_ffffffffffffdb88,(StorageBaseType *)in_stack_ffffffffffffdb80);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
      ::operator*(in_stack_ffffffffffffdb58,in_stack_ffffffffffffdb50);
      Eigen::MatrixBase<Eigen::Matrix<double,3,9,0,3,9>>::operator+
                ((MatrixBase<Eigen::Matrix<double,_3,_9,_0,_3,_9>_> *)in_stack_ffffffffffffdb68,
                 (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>_>
                  *)in_stack_ffffffffffffdb60);
      Eigen::Matrix<double,3,9,0,3,9>::operator=
                ((Matrix<double,_3,_9,_0,_3,_9> *)in_stack_ffffffffffffdb40,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_9,_0,_3,_9>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>_>_>
                  *)in_stack_ffffffffffffdb38);
      Eigen::DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::transpose
                ((DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)in_stack_ffffffffffffdb38);
      Eigen::operator*(in_stack_ffffffffffffdb88,(StorageBaseType *)in_stack_ffffffffffffdb80);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,9,1,0,9,1>const>const,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>const>>
      ::operator*((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>_>
                   *)in_stack_ffffffffffffdb58,in_stack_ffffffffffffdb50);
      Eigen::MatrixBase<Eigen::Matrix<double,9,9,0,9,9>>::operator-
                ((MatrixBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_> *)in_stack_ffffffffffffdb68,
                 (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>_>
                  *)in_stack_ffffffffffffdb60);
      Eigen::Matrix<double,9,9,0,9,9>::operator=
                ((Matrix<double,_9,_9,_0,_9,_9> *)in_stack_ffffffffffffdb40,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_9,_9,_0,_9,_9>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>_>_>
                  *)in_stack_ffffffffffffdb38);
      local_1940 = (non_const_type)
                   Eigen::DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::transpose
                             ((DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)
                              in_stack_ffffffffffffdb38);
      Eigen::operator*(in_stack_ffffffffffffdb88,(StorageBaseType *)in_stack_ffffffffffffdb80);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,9,1,0,9,1>const>const,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>const>>
      ::operator*((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>_>
                   *)in_stack_ffffffffffffdb58,in_stack_ffffffffffffdb50);
      Eigen::MatrixBase<Eigen::Matrix<double,9,9,0,9,9>>::operator-
                ((MatrixBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_> *)in_stack_ffffffffffffdb68,
                 (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>_>
                  *)in_stack_ffffffffffffdb60);
      Eigen::Matrix<double,9,9,0,9,9>::operator=
                ((Matrix<double,_9,_9,_0,_9,_9> *)in_stack_ffffffffffffdb40,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_9,_9,_0,_9,_9>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>_>_>
                  *)in_stack_ffffffffffffdb38);
      local_19e0 = (non_const_type)
                   Eigen::DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>::transpose
                             ((DenseBase<Eigen::Matrix<double,_1,_9,_1,_1,_9>_> *)
                              in_stack_ffffffffffffdb38);
      Eigen::operator*(in_stack_ffffffffffffdb88,(StorageBaseType *)in_stack_ffffffffffffdb80);
      Eigen::
      MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,9,1,0,9,1>const>const,Eigen::Transpose<Eigen::Matrix<double,1,9,1,1,9>>const>>
      ::operator*((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>_>
                   *)in_stack_ffffffffffffdb58,in_stack_ffffffffffffdb50);
      Eigen::MatrixBase<Eigen::Matrix<double,9,9,0,9,9>>::operator-
                ((MatrixBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_> *)in_stack_ffffffffffffdb68,
                 (MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>_>
                  *)in_stack_ffffffffffffdb60);
      Eigen::Matrix<double,9,9,0,9,9>::operator=
                ((Matrix<double,_9,_9,_0,_9,_9> *)in_stack_ffffffffffffdb40,
                 (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_9,_9,_0,_9,_9>,_const_Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_1,_0,_9,_1>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_1,_9,_1,_1,_9>_>_>,_Eigen::Matrix<double,_1,_9,_1,_1,_9>,_0>_>_>
                  *)in_stack_ffffffffffffdb38);
    }
  }
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_ffffffffffffdb40,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)in_stack_ffffffffffffdb38);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_ffffffffffffdb40,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)in_stack_ffffffffffffdb38);
  for (local_1e70 = (MatrixXd *)0x0; plVar4 = local_10, local_1e70 < local_30;
      local_1e70 = (MatrixXd *)
                   ((long)&(local_1e70->
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                           m_storage.m_data + 1)) {
    iVar5 = Indices::operator[](in_stack_ffffffffffffdb48,
                                (int)((ulong)in_stack_ffffffffffffdb40 >> 0x20));
    (**(code **)(*plVar4 + 0x30))(local_1ec8,plVar4,(long)iVar5);
    plVar4 = local_10;
    iVar5 = Indices::operator[](in_stack_ffffffffffffdb48,
                                (int)((ulong)in_stack_ffffffffffffdb40 >> 0x20));
    (**(code **)(*plVar4 + 0x10))(local_1ee0,plVar4,(long)iVar5);
    local_1e80 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                           (in_stack_ffffffffffffdb40,
                            (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                            in_stack_ffffffffffffdb38);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_ffffffffffffdb60,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)in_stack_ffffffffffffdb58);
    plVar4 = local_10;
    iVar5 = Indices::operator[](in_stack_ffffffffffffdb48,
                                (int)((ulong)in_stack_ffffffffffffdb40 >> 0x20));
    (**(code **)(*plVar4 + 0x40))(local_1f38,plVar4,(long)iVar5);
    plVar4 = local_10;
    iVar5 = Indices::operator[](in_stack_ffffffffffffdb48,
                                (int)((ulong)in_stack_ffffffffffffdb40 >> 0x20));
    (**(code **)(*plVar4 + 0x18))(local_1f50,plVar4,(long)iVar5);
    local_1ef0 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                           (in_stack_ffffffffffffdb40,
                            (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                            in_stack_ffffffffffffdb38);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_ffffffffffffdb60,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)in_stack_ffffffffffffdb58);
  }
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/
            (in_stack_ffffffffffffdb98,(unsigned_long *)in_stack_ffffffffffffdb90);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_ffffffffffffdb40,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)in_stack_ffffffffffffdb38);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/
            (in_stack_ffffffffffffdb98,(unsigned_long *)in_stack_ffffffffffffdb90);
  Eigen::Matrix<double,3,1,0,3,1>::operator=
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_ffffffffffffdb40,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)in_stack_ffffffffffffdb38);
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_ffffffffffffdb60,
             (int *)in_stack_ffffffffffffdb58,(int *)in_stack_ffffffffffffdb50);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Zero();
  Eigen::Matrix<double,-1,-1,0,-1,-1>::operator=
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_stack_ffffffffffffdb40,
             in_stack_ffffffffffffdb38);
  for (Hcross_00 = (MatrixXd *)0x0; plVar4 = local_10, Hcross_00 < local_30;
      Hcross_00 = (MatrixXd *)
                  ((long)&(Hcross_00->
                          super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                          m_storage.m_data + 1)) {
    iVar5 = Indices::operator[](in_stack_ffffffffffffdb48,
                                (int)((ulong)in_stack_ffffffffffffdb40 >> 0x20));
    (**(code **)(*plVar4 + 0x30))(local_2068,plVar4,(long)iVar5);
    plVar4 = local_10;
    iVar5 = Indices::operator[](in_stack_ffffffffffffdb48,
                                (int)((ulong)in_stack_ffffffffffffdb40 >> 0x20));
    (**(code **)(*plVar4 + 0x10))(local_2080,plVar4,(long)iVar5);
    PVar29 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                       (in_stack_ffffffffffffdb40,
                        (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                        in_stack_ffffffffffffdb38);
    local_2020 = PVar29;
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>::
    operator-((MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
               *)in_stack_ffffffffffffdb68,
              (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_ffffffffffffdb60);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_ffffffffffffdb40,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)in_stack_ffffffffffffdb38);
    plVar4 = local_10;
    iVar5 = Indices::operator[](in_stack_ffffffffffffdb48,
                                (int)((ulong)in_stack_ffffffffffffdb40 >> 0x20));
    (**(code **)(*plVar4 + 0x40))(local_2110,plVar4,(long)iVar5);
    plVar4 = local_10;
    iVar5 = Indices::operator[](in_stack_ffffffffffffdb48,
                                (int)((ulong)in_stack_ffffffffffffdb40 >> 0x20));
    (**(code **)(*plVar4 + 0x18))(local_2128,plVar4,(long)iVar5);
    PVar29 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                       (in_stack_ffffffffffffdb40,
                        (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                        in_stack_ffffffffffffdb38);
    local_20c8 = PVar29;
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>::
    operator-((MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
               *)in_stack_ffffffffffffdb68,
              (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_ffffffffffffdb60);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_ffffffffffffdb40,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)in_stack_ffffffffffffdb38);
    local_2140 = (non_const_type)
                 Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                           ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                            in_stack_ffffffffffffdb38);
    PVar30 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator*
                       ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                        in_stack_ffffffffffffdb40,
                        (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)
                        in_stack_ffffffffffffdb38);
    local_2138 = PVar30;
    Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_stack_ffffffffffffdb60,
               (MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_0>_>
                *)in_stack_ffffffffffffdb58);
  }
  math::arun(Hcross_00);
  math::rot2cayley(in_stack_ffffffffffffdc88);
  x1P_00 = &local_400;
  other = local_318;
  modules::ge_main2(in_stack_ffffffffffffe6f0,in_stack_ffffffffffffe6e8,in_stack_ffffffffffffe6e0,
                    in_stack_ffffffffffffe6d8,in_stack_ffffffffffffe6d0,in_stack_ffffffffffffe6c8,
                    x1P_00,&local_4e8,&local_5d0,&local_6b8,&local_7a0,local_a38,&local_cd0,
                    &local_f68,(Matrix<double,_9,_9,_0,_9,_9> *)&stack0xffffffffffffde60,local_20,
                    in_stack_ffffffffffffdb90);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)x1P_00,other);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)0xc49c04);
  return in_RDI;
}

Assistant:

rotation_t ge(
    const RelativeAdapterBase & adapter,
    const Indices & indices,
    geOutput_t & output,
    bool useWeights )
{ 
  size_t numberCorrespondences = indices.size();
  assert(numberCorrespondences > 5);

  Eigen::Matrix3d xxF = Eigen::Matrix3d::Zero();
  Eigen::Matrix3d yyF = Eigen::Matrix3d::Zero();
  Eigen::Matrix3d zzF = Eigen::Matrix3d::Zero();
  Eigen::Matrix3d xyF = Eigen::Matrix3d::Zero();
  Eigen::Matrix3d yzF = Eigen::Matrix3d::Zero();
  Eigen::Matrix3d zxF = Eigen::Matrix3d::Zero();
  
  Eigen::Matrix<double,3,9> x1P = Eigen::Matrix<double,3,9>::Zero();
  Eigen::Matrix<double,3,9> y1P = Eigen::Matrix<double,3,9>::Zero();
  Eigen::Matrix<double,3,9> z1P = Eigen::Matrix<double,3,9>::Zero();
  Eigen::Matrix<double,3,9> x2P = Eigen::Matrix<double,3,9>::Zero();
  Eigen::Matrix<double,3,9> y2P = Eigen::Matrix<double,3,9>::Zero();
  Eigen::Matrix<double,3,9> z2P = Eigen::Matrix<double,3,9>::Zero();
  
  Eigen::Matrix<double,9,9> m11P = Eigen::Matrix<double,9,9>::Zero();
  Eigen::Matrix<double,9,9> m12P = Eigen::Matrix<double,9,9>::Zero();
  Eigen::Matrix<double,9,9> m22P = Eigen::Matrix<double,9,9>::Zero();

  //compute the norm of all the scores
  double norm = 0.0;
  for(size_t i=0; i < numberCorrespondences; i++)
    norm += pow(adapter.getWeight(indices[i]),2);
  norm = sqrt(norm);

  //Fill summation terms
  for(size_t i=0; i < numberCorrespondences; i++)
  {
    //get the weight of this feature
    double weight = 1.0;
    if( useWeights )
      weight = adapter.getWeight(indices[i])/norm;
    
    //unrotate the bearing vectors
    bearingVector_t f1 = adapter.getCamRotation1(indices[i]) *
        adapter.getBearingVector1(indices[i]);
    bearingVector_t f2 = adapter.getCamRotation2(indices[i]) *
        adapter.getBearingVector2(indices[i]);
    
    //compute the standard summation terms
    Eigen::Matrix3d F = f2*f2.transpose();

    xxF = xxF + weight*f1[0]*f1[0]*F;
    yyF = yyF + weight*f1[1]*f1[1]*F;
    zzF = zzF + weight*f1[2]*f1[2]*F;
    xyF = xyF + weight*f1[0]*f1[1]*F;
    yzF = yzF + weight*f1[1]*f1[2]*F;
    zxF = zxF + weight*f1[2]*f1[0]*F;
    
    //now compute the "cross"-summation terms    
    Eigen::Vector3d t1 = adapter.getCamOffset1(indices[i]);
    Eigen::Vector3d t2 = adapter.getCamOffset2(indices[i]);
    
    Eigen::Matrix<double,1,9> f2_19;
    double temp = f1[1]*t1[2]-f1[2]*t1[1];
    f2_19(0,0) = f2[0] * temp;
    f2_19(0,1) = f2[1] * temp;
    f2_19(0,2) = f2[2] * temp;
    temp = f1[2]*t1[0]-f1[0]*t1[2];
    f2_19(0,3) = f2[0] * temp;
    f2_19(0,4) = f2[1] * temp;
    f2_19(0,5) = f2[2] * temp;
    temp = f1[0]*t1[1]-f1[1]*t1[0];
    f2_19(0,6) = f2[0] * temp;
    f2_19(0,7) = f2[1] * temp;
    f2_19(0,8) = f2[2] * temp;
    
    Eigen::Matrix<double,1,9> f1_19;
    temp = f2[1]*t2[2]-f2[2]*t2[1];
    f1_19(0,0) = f1[0] * temp;
    f1_19(0,1) = f1[1] * temp;
    f1_19(0,2) = f1[2] * temp;
    temp = f2[2]*t2[0]-f2[0]*t2[2];
    f1_19(0,3) = f1[0] * temp;
    f1_19(0,4) = f1[1] * temp;
    f1_19(0,5) = f1[2] * temp;
    temp = f2[0]*t2[1]-f2[1]*t2[0];
    f1_19(0,6) = f1[0] * temp;
    f1_19(0,7) = f1[1] * temp;
    f1_19(0,8) = f1[2] * temp;
    
    if( useWeights )
    {
      x1P = x1P + ( (weight * f1[0]) * f2 ) * f1_19;
      y1P = y1P + ( (weight * f1[1]) * f2 ) * f1_19;
      z1P = z1P + ( (weight * f1[2]) * f2 ) * f1_19;
      
      x2P = x2P + ( (weight * f1[0]) * f2 ) * f2_19;
      y2P = y2P + ( (weight * f1[1]) * f2 ) * f2_19;
      z2P = z2P + ( (weight * f1[2]) * f2 ) * f2_19;
      
      m11P = m11P - ( weight * f1_19.transpose() ) * f1_19;
      m22P = m22P - ( weight * f2_19.transpose() ) * f2_19;
      m12P = m12P - ( weight * f2_19.transpose() ) * f1_19;
    }
    else
    {
      x1P = x1P + ( f1[0] * f2 ) * f1_19;
      y1P = y1P + ( f1[1] * f2 ) * f1_19;
      z1P = z1P + ( f1[2] * f2 ) * f1_19;
      
      x2P = x2P + ( f1[0]) * f2 * f2_19;
      y2P = y2P + ( f1[1]) * f2 * f2_19;
      z2P = z2P + ( f1[2]) * f2 * f2_19;
      
      m11P = m11P - f1_19.transpose() * f1_19;
      m22P = m22P - f2_19.transpose() * f2_19;
      m12P = m12P - f2_19.transpose() * f1_19;
    }
  }

  Eigen::Vector3d pointsCenter1 = Eigen::Vector3d::Zero();
  Eigen::Vector3d pointsCenter2 = Eigen::Vector3d::Zero();

  for( size_t i = 0; i < numberCorrespondences; i++ )
  {
    pointsCenter1 += adapter.getCamRotation1(indices[i]) *
        adapter.getBearingVector1(indices[i]);
    pointsCenter2 += adapter.getCamRotation2(indices[i]) *
        adapter.getBearingVector2(indices[i]);
  }

  pointsCenter1 = pointsCenter1 / numberCorrespondences;
  pointsCenter2 = pointsCenter2 / numberCorrespondences;

  Eigen::MatrixXd Hcross(3,3);
  Hcross = Eigen::Matrix3d::Zero();

  for( size_t i = 0; i < numberCorrespondences; i++ )
  {
    Eigen::Vector3d f =      adapter.getCamRotation1(indices[i]) *
        adapter.getBearingVector1(indices[i]) - pointsCenter1;
    Eigen::Vector3d fprime = adapter.getCamRotation2(indices[i]) *
        adapter.getBearingVector2(indices[i]) - pointsCenter2;
    Hcross += fprime * f.transpose();
  }

  rotation_t startingRotation = math::arun(Hcross);

  //Do minimization
  modules::ge_main2(
      xxF, yyF, zzF, xyF, yzF, zxF,
      x1P, y1P, z1P, x2P, y2P, z2P,
      m11P, m12P, m22P, math::rot2cayley(startingRotation), output);

  return output.rotation;
}